

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_request.c
# Opt level: O3

int tnt_request_writeout(tnt_stream *s,tnt_request *req,uint64_t *sync)

{
  byte *pbVar1;
  tnt_request_t tVar2;
  tnt_iterator_t tVar3;
  bool bVar4;
  undefined1 uVar5;
  uint uVar6;
  int iVar7;
  byte *pbVar8;
  ssize_t sVar9;
  ulong uVar10;
  iovec *piVar11;
  ulong *puVar12;
  ushort uVar13;
  long lVar14;
  byte bVar15;
  char *pcVar16;
  byte *pbVar17;
  byte *pbVar18;
  ulong uVar19;
  undefined1 uStack_148;
  undefined1 auStack_147 [7];
  char header [128];
  iovec v [10];
  
  tVar2 = (req->hdr).type;
  if (((sync != (uint64_t *)0x0) && (*sync == 0x7fffffffffffffff)) &&
     ((~s->reqid & 0x7fffffffffffffff) == 0)) {
    s->reqid = 0;
  }
  uVar10 = s->reqid;
  s->reqid = uVar10 + 1;
  (req->hdr).sync = uVar10;
  pbVar18 = (byte *)(header + 1);
  header[1] = -0x7e;
  header[2] = '\0';
  if (tVar2 < 0x80) {
    lVar14 = 1;
    header[3] = (char)tVar2;
  }
  else if (tVar2 < 0x100) {
    header[3] = -0x34;
    header[4] = (char)tVar2;
    lVar14 = 2;
  }
  else if (tVar2 < 0x10000) {
    header[3] = -0x33;
    uVar13 = (ushort)tVar2 << 8 | (ushort)tVar2 >> 8;
    header[4] = (char)uVar13;
    header[5] = (char)(uVar13 >> 8);
    lVar14 = 3;
  }
  else {
    header[3] = -0x32;
    header._4_4_ = tVar2 >> 0x18 | (tVar2 & 0xff0000) >> 8 | (tVar2 & 0xff00) << 8 | tVar2 << 0x18;
    lVar14 = 5;
  }
  header[lVar14 + 3] = '\x01';
  pcVar16 = header + lVar14 + 4;
  if (uVar10 < 0x80) {
    *pcVar16 = (char)uVar10;
    lVar14 = 1;
  }
  else if (uVar10 < 0x100) {
    header[lVar14 + 4] = -0x34;
    header[lVar14 + 5] = (char)uVar10;
    lVar14 = 2;
  }
  else if (uVar10 < 0x10000) {
    header[lVar14 + 4] = -0x33;
    *(ushort *)(header + lVar14 + 5) = (ushort)uVar10 << 8 | (ushort)uVar10 >> 8;
    lVar14 = 3;
  }
  else if (uVar10 >> 0x20 == 0) {
    header[lVar14 + 4] = -0x32;
    uVar6 = (uint)uVar10;
    *(uint *)(header + lVar14 + 5) =
         uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    lVar14 = 5;
  }
  else {
    header[lVar14 + 4] = -0x31;
    *(ulong *)(header + lVar14 + 5) =
         uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 | (uVar10 & 0xff0000000000) >> 0x18 |
         (uVar10 & 0xff00000000) >> 8 | (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 |
         (uVar10 & 0xff00) << 0x28 | uVar10 << 0x38;
    lVar14 = 9;
  }
  pbVar1 = (byte *)(pcVar16 + lVar14);
  if ((tVar2 < TNT_OP_CALL_16) || (tVar2 == TNT_OP_UPSERT)) {
    pbVar1[1] = 0x10;
    uVar6 = req->space_id;
    if (uVar6 < 0x80) {
      pbVar1[2] = (byte)uVar6;
      lVar14 = 1;
    }
    else if (uVar6 < 0x100) {
      pbVar1[2] = 0xcc;
      pbVar1[3] = (byte)uVar6;
      lVar14 = 2;
    }
    else if (uVar6 < 0x10000) {
      pbVar1[2] = 0xcd;
      *(ushort *)(pbVar1 + 3) = (ushort)uVar6 << 8 | (ushort)uVar6 >> 8;
      lVar14 = 3;
    }
    else {
      pbVar1[2] = 0xce;
      *(uint *)(pbVar1 + 3) =
           uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
      lVar14 = 5;
    }
    pbVar17 = pbVar1 + 2 + lVar14;
    bVar15 = 1;
  }
  else {
    pbVar17 = (byte *)(pcVar16 + lVar14 + 1);
    bVar15 = 0;
  }
  uVar6 = req->index_id;
  if (((uVar6 != 0) && (tVar2 < TNT_OP_CALL_16)) && ((0x32U >> (tVar2 & 0x1f) & 1) != 0)) {
    *pbVar17 = 0x11;
    if (uVar6 < 0x80) {
      pbVar17[1] = (byte)uVar6;
      lVar14 = 1;
    }
    else if (uVar6 < 0x100) {
      pbVar17[1] = 0xcc;
      pbVar17[2] = (byte)uVar6;
      lVar14 = 2;
    }
    else if (uVar6 < 0x10000) {
      pbVar17[1] = 0xcd;
      *(ushort *)(pbVar17 + 2) = (ushort)uVar6 << 8 | (ushort)uVar6 >> 8;
      lVar14 = 3;
    }
    else {
      pbVar17[1] = 0xce;
      *(uint *)(pbVar17 + 2) =
           uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
      lVar14 = 5;
    }
    pbVar17 = pbVar17 + 1 + lVar14;
    bVar15 = bVar15 + 1;
  }
  if (tVar2 == TNT_OP_SELECT) {
    *pbVar17 = 0x12;
    uVar6 = req->limit;
    if (uVar6 < 0x80) {
      pbVar17[1] = (byte)uVar6;
      lVar14 = 1;
    }
    else if (uVar6 < 0x100) {
      pbVar17[1] = 0xcc;
      pbVar17[2] = (byte)uVar6;
      lVar14 = 2;
    }
    else if (uVar6 < 0x10000) {
      pbVar17[1] = 0xcd;
      *(ushort *)(pbVar17 + 2) = (ushort)uVar6 << 8 | (ushort)uVar6 >> 8;
      lVar14 = 3;
    }
    else {
      pbVar17[1] = 0xce;
      *(uint *)(pbVar17 + 2) =
           uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
      lVar14 = 5;
    }
    pbVar17 = pbVar17 + 1 + lVar14;
    uVar6 = req->offset;
    if (uVar6 == 0) {
      bVar15 = bVar15 + 1;
    }
    else {
      *pbVar17 = 0x13;
      if (uVar6 < 0x80) {
        pbVar17[1] = (byte)uVar6;
        lVar14 = 1;
      }
      else if (uVar6 < 0x100) {
        pbVar17[1] = 0xcc;
        pbVar17[2] = (byte)uVar6;
        lVar14 = 2;
      }
      else if (uVar6 < 0x10000) {
        pbVar17[1] = 0xcd;
        *(ushort *)(pbVar17 + 2) = (ushort)uVar6 << 8 | (ushort)uVar6 >> 8;
        lVar14 = 3;
      }
      else {
        pbVar17[1] = 0xce;
        *(uint *)(pbVar17 + 2) =
             uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
        lVar14 = 5;
      }
      pbVar17 = pbVar17 + 1 + lVar14;
      bVar15 = bVar15 + 2;
    }
    tVar3 = req->iterator;
    if (tVar3 != TNT_ITER_EQ) {
      *pbVar17 = 0x14;
      if (tVar3 < 0x80) {
        pbVar17[1] = (byte)tVar3;
        lVar14 = 1;
      }
      else if (tVar3 < 0x100) {
        pbVar17[1] = 0xcc;
        pbVar17[2] = (byte)tVar3;
        lVar14 = 2;
      }
      else if (tVar3 < 0x10000) {
        pbVar17[1] = 0xcd;
        *(ushort *)(pbVar17 + 2) = (ushort)tVar3 << 8 | (ushort)tVar3 >> 8;
        lVar14 = 3;
      }
      else {
        pbVar17[1] = 0xce;
        *(tnt_iterator_t *)(pbVar17 + 2) =
             tVar3 >> 0x18 | (tVar3 & 0xff0000) >> 8 | (tVar3 & 0xff00) << 8 | tVar3 << 0x18;
        lVar14 = 5;
      }
      pbVar17 = pbVar17 + 1 + lVar14;
      bVar15 = bVar15 + 1;
    }
  }
  pcVar16 = req->key;
  if (pcVar16 == (char *)0x0) {
    uVar10 = 1;
    pbVar8 = pbVar18;
    goto LAB_00116cae;
  }
  iVar7 = -1;
  switch(tVar2) {
  case TNT_OP_SELECT:
  case TNT_OP_UPDATE:
  case TNT_OP_DELETE:
    *pbVar17 = 0x20;
    break;
  default:
    goto switchD_00116bdf_caseD_2;
  case TNT_OP_CALL_16:
  case TNT_OP_CALL:
    *pbVar17 = 0x22;
    goto LAB_00116bfc;
  case TNT_OP_EVAL:
    *pbVar17 = 0x27;
LAB_00116bfc:
    lVar14 = (long)req->key_end - (long)pcVar16;
    uVar6 = (uint)lVar14;
    if (uVar6 < 0x20) {
      pbVar17[1] = (byte)lVar14 | 0xa0;
      lVar14 = 1;
    }
    else if (uVar6 < 0x100) {
      pbVar17[1] = 0xd9;
      pbVar17[2] = (byte)lVar14;
      lVar14 = 2;
    }
    else if (uVar6 < 0x10000) {
      pbVar17[1] = 0xda;
      *(ushort *)(pbVar17 + 2) = (ushort)lVar14 << 8 | (ushort)lVar14 >> 8;
      lVar14 = 3;
    }
    else {
      pbVar17[1] = 0xdb;
      *(uint *)(pbVar17 + 2) =
           uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
      lVar14 = 5;
    }
    pbVar8 = pbVar17 + 1 + lVar14;
    goto LAB_00116c77;
  case TNT_OP_UPSERT:
    *pbVar17 = 0x28;
  }
  pbVar8 = pbVar17 + 1;
LAB_00116c77:
  v[1].iov_base = pbVar8 + -(long)pbVar18;
  v[1].iov_len = (size_t)pcVar16;
  v[2].iov_base = req->key_end + -(long)pcVar16;
  bVar15 = bVar15 + 1;
  uVar10 = 3;
  pbVar17 = pbVar8;
  v[0].iov_len = (size_t)pbVar18;
LAB_00116cae:
  pcVar16 = req->tuple;
  pbVar18 = pbVar8;
  if (pcVar16 != (char *)0x0) {
    *pbVar17 = 0x21;
    pbVar18 = pbVar17 + 1;
    uVar19 = (ulong)(uint)((int)uVar10 << 4);
    *(byte **)(header + uVar19 + 0x78) = pbVar8;
    *(long *)((long)&v[0].iov_base + uVar19) = (long)pbVar18 - (long)pbVar8;
    *(char **)((long)&v[0].iov_len + uVar19) = pcVar16;
    uVar10 = (ulong)((int)uVar10 + 2);
    *(long *)((long)&v[1].iov_base + uVar19) = (long)req->tuple_end - (long)pcVar16;
    bVar15 = bVar15 + 1;
    pbVar17 = pbVar18;
  }
  uVar6 = req->index_base;
  uVar19 = (ulong)(int)uVar6;
  if ((uVar19 != 0) && ((tVar2 == TNT_OP_UPSERT || (tVar2 == TNT_OP_UPDATE)))) {
    *pbVar17 = 0x15;
    if (uVar6 < 0x80) {
      pbVar17[1] = (byte)uVar6;
      lVar14 = 1;
    }
    else if (uVar6 < 0x100) {
      pbVar17[1] = 0xcc;
      pbVar17[2] = (byte)uVar6;
      lVar14 = 2;
    }
    else if (uVar6 < 0x10000) {
      pbVar17[1] = 0xcd;
      *(ushort *)(pbVar17 + 2) = (ushort)uVar6 << 8 | (ushort)uVar6 >> 8;
      lVar14 = 3;
    }
    else if ((int)uVar6 < 0) {
      pbVar17[1] = 0xcf;
      *(ulong *)(pbVar17 + 2) =
           uVar19 >> 0x38 | (uVar19 & 0xff000000000000) >> 0x28 | (uVar19 & 0xff0000000000) >> 0x18
           | (uVar19 & 0xff00000000) >> 8 | (uVar19 & 0xff000000) << 8 | (uVar19 & 0xff0000) << 0x18
           | (uVar19 & 0xff00) << 0x28 | uVar19 << 0x38;
      lVar14 = 9;
    }
    else {
      pbVar17[1] = 0xce;
      *(uint *)(pbVar17 + 2) =
           uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
      lVar14 = 5;
    }
    pbVar17 = pbVar17 + 1 + lVar14;
    bVar15 = bVar15 + 1;
  }
  uVar6 = (uint)uVar10;
  if ((long)pbVar17 - (long)pbVar18 == 0) {
    *pbVar1 = bVar15 | 0x80;
    if (1 < uVar6) goto LAB_00116dc9;
    header._120_8_ = auStack_147 + 3;
    v[0].iov_base = (void *)0x5;
    uVar10 = 1;
    puVar12 = (ulong *)(auStack_147 + 4);
    uVar19 = 0;
LAB_00116e4e:
    uVar6 = (uint)uVar19;
    *(uint *)puVar12 =
         uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
    uVar5 = 0xce;
  }
  else {
    *(byte **)(header + (ulong)(uVar6 << 4) + 0x78) = pbVar18;
    uVar10 = (ulong)(uVar6 + 1);
    *(long *)((long)&v[0].iov_base + (ulong)(uVar6 << 4)) = (long)pbVar17 - (long)pbVar18;
    *pbVar1 = bVar15 | 0x80;
LAB_00116dc9:
    piVar11 = v;
    lVar14 = uVar10 - 1;
    uVar19 = 0;
    do {
      piVar11 = piVar11 + 1;
      uVar19 = uVar19 + (long)piVar11->iov_base;
      lVar14 = lVar14 + -1;
    } while (lVar14 != 0);
    bVar4 = uVar19 >> 0x20 == 0;
    v[0].iov_base = (void *)((ulong)!bVar4 * 4 + 5);
    header._120_8_ = &uStack_148 + (ulong)bVar4 * 4;
    puVar12 = (ulong *)(auStack_147 + (ulong)bVar4 * 4);
    if (bVar4) goto LAB_00116e4e;
    *puVar12 = uVar19 >> 0x38 | (uVar19 & 0xff000000000000) >> 0x28 |
               (uVar19 & 0xff0000000000) >> 0x18 | (uVar19 & 0xff00000000) >> 8 |
               (uVar19 & 0xff000000) << 8 | (uVar19 & 0xff0000) << 0x18 | (uVar19 & 0xff00) << 0x28
               | uVar19 << 0x38;
    uVar5 = 0xcf;
  }
  *(undefined1 *)header._120_8_ = uVar5;
  sVar9 = (*s->writev)(s,(iovec *)(header + 0x78),(int)uVar10);
  iVar7 = -(uint)(sVar9 == -1);
  if ((sync != (uint64_t *)0x0) && (sVar9 != -1)) {
    *sync = (req->hdr).sync;
    iVar7 = 0;
  }
switchD_00116bdf_caseD_2:
  return iVar7;
}

Assistant:

int
tnt_request_writeout(struct tnt_stream *s, struct tnt_request *req,
		     uint64_t *sync) {
	enum tnt_request_t tp = req->hdr.type;
	if (sync != NULL && *sync == INT64_MAX &&
	    (s->reqid & INT64_MAX) == INT64_MAX) {
		s->reqid = 0;
	}
	req->hdr.sync = s->reqid++;
	/* header */
	/* int (9) + 1 + sync + 1 + op */
	struct iovec v[10]; int v_sz = 0;
	char header[128];
	char *pos = header + 9;
	char *begin = pos;
	v[v_sz].iov_base = begin;
	v[v_sz++].iov_len  = 0;
	pos = mp_encode_map(pos, 2);              /* 1 */
	pos = mp_encode_uint(pos, TNT_CODE);      /* 1 */
	pos = mp_encode_uint(pos, req->hdr.type); /* 1 */
	pos = mp_encode_uint(pos, TNT_SYNC);      /* 1 */
	pos = mp_encode_uint(pos, req->hdr.sync); /* 9 */
	char *map = pos++;                        /* 1 */
	size_t nd = 0;
	if (tp < TNT_OP_CALL_16 || tp == TNT_OP_UPSERT) {
		pos = mp_encode_uint(pos, TNT_SPACE);     /* 1 */
		pos = mp_encode_uint(pos, req->space_id); /* 5 */
		nd += 1;
	}
	if (req->index_id && (tp == TNT_OP_SELECT ||
			      tp == TNT_OP_UPDATE ||
			      tp == TNT_OP_DELETE)) {
		pos = mp_encode_uint(pos, TNT_INDEX);     /* 1 */
		pos = mp_encode_uint(pos, req->index_id); /* 5 */
		nd += 1;
	}
	if (tp == TNT_OP_SELECT) {
		pos = mp_encode_uint(pos, TNT_LIMIT);  /* 1 */
		pos = mp_encode_uint(pos, req->limit); /* 5 */
		nd += 1;
	}
	if (req->offset && tp == TNT_OP_SELECT) {
		pos = mp_encode_uint(pos, TNT_OFFSET);  /* 1 */
		pos = mp_encode_uint(pos, req->offset); /* 5 */
		nd += 1;
	}
	if (req->iterator && tp == TNT_OP_SELECT) {
		pos = mp_encode_uint(pos, TNT_ITERATOR);  /* 1 */
		pos = mp_encode_uint(pos, req->iterator); /* 1 */
		nd += 1;
	}
	if (req->key) {
		switch (tp) {
		case TNT_OP_EVAL:
			pos = mp_encode_uint(pos, TNT_EXPRESSION);          /* 1 */
			pos = mp_encode_strl(pos, req->key_end - req->key); /* 5 */
			break;
		case TNT_OP_CALL_16:
		case TNT_OP_CALL:
			pos = mp_encode_uint(pos, TNT_FUNCTION);            /* 1 */
			pos = mp_encode_strl(pos, req->key_end - req->key); /* 5 */
			break;
		case TNT_OP_SELECT:
		case TNT_OP_UPDATE:
		case TNT_OP_DELETE:
			pos = mp_encode_uint(pos, TNT_KEY); /* 1 */
			break;
		case TNT_OP_UPSERT:
			pos = mp_encode_uint(pos, TNT_OPS); /* 1 */
			break;
		default:
			return -1;
		}
		v[v_sz].iov_base  = begin;
		v[v_sz++].iov_len = pos - begin;
		begin = pos;
		v[v_sz].iov_base  = (void *)req->key;
		v[v_sz++].iov_len = req->key_end - req->key;
		nd += 1;
	}
	if (req->tuple) {
		pos = mp_encode_uint(pos, TNT_TUPLE); /* 1 */
		v[v_sz].iov_base  = begin;
		v[v_sz++].iov_len = pos - begin;
		begin = pos;
		v[v_sz].iov_base  = (void *)req->tuple;
		v[v_sz++].iov_len = req->tuple_end - req->tuple;
		nd += 1;
	}
	if (req->index_base && (tp == TNT_OP_UPDATE || tp == TNT_OP_UPSERT)) {
		pos = mp_encode_uint(pos, TNT_INDEX_BASE);  /* 1 */
		pos = mp_encode_uint(pos, req->index_base); /* 1 */
		nd += 1;
	}
	assert(mp_sizeof_map(nd) == 1);
	if (pos != begin) {
		v[v_sz].iov_base  = begin;
		v[v_sz++].iov_len = pos - begin;
	}
	mp_encode_map(map, nd);

	size_t plen = 0;
	for (int i = 1; i < v_sz; ++i) plen += v[i].iov_len;
	size_t hlen = mp_sizeof_luint32(plen);
	v[0].iov_base -= hlen;
	v[0].iov_len  += hlen;
	mp_encode_luint32(v[0].iov_base, plen);
	ssize_t rv = s->writev(s, v, v_sz);
	if (rv == -1)
		return -1;
	if (sync != NULL)
		*sync = req->hdr.sync;
	return 0;
}